

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O0

void __thiscall Js::ScriptContextProfiler::~ScriptContextProfiler(ScriptContextProfiler *this)

{
  PageAllocator *pPVar1;
  ScriptContextProfiler *this_local;
  
  if (this->profilerArena != (ArenaAllocator *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
              (&Memory::HeapAllocator::Instance,this->profilerArena);
  }
  if ((this->recycler != (Recycler *)0x0) &&
     (this->backgroundRecyclerProfilerArena != (ArenaAllocator *)0x0)) {
    pPVar1 = Memory::ArenaData::GetPageAllocator
                       (&(this->backgroundRecyclerProfilerArena->
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                         super_ArenaData);
    (**pPVar1->_vptr_PageAllocatorBase)();
    Memory::Recycler::ReleaseBackgroundProfilerArena
              (this->recycler,this->backgroundRecyclerProfilerArena);
  }
  return;
}

Assistant:

ScriptContextProfiler::~ScriptContextProfiler()
    {
        if (profilerArena)
        {
            HeapDelete(profilerArena);
        }

        if (recycler && backgroundRecyclerProfilerArena)
        {
#if DBG
            //We are freeing from main thread, disable thread check assert.
            backgroundRecyclerProfilerArena->GetPageAllocator()->SetDisableThreadAccessCheck();
#endif
            recycler->ReleaseBackgroundProfilerArena(backgroundRecyclerProfilerArena);
        }
    }